

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void close_var_refs(JSRuntime *rt,JSStackFrame *sf)

{
  byte *pbVar1;
  ushort uVar2;
  list_head *plVar3;
  list_head *plVar4;
  list_head *plVar5;
  list_head *plVar6;
  list_head *plVar7;
  uint uVar8;
  
  plVar7 = &rt->gc_obj_list;
  plVar6 = (sf->var_ref_list).next;
  while (plVar6 != &sf->var_ref_list) {
    plVar3 = plVar6->next;
    uVar2 = *(ushort *)((long)&plVar6[-1].next + 6);
    if (((ulong)plVar6[-1].next & 0x20000000000) == 0) {
      plVar4 = (list_head *)sf->var_buf[uVar2].u.ptr;
      plVar5 = (list_head *)sf->var_buf[uVar2].tag;
      uVar8 = (uint)plVar5;
    }
    else {
      plVar4 = (list_head *)sf->arg_buf[uVar2].u.ptr;
      plVar5 = (list_head *)sf->arg_buf[uVar2].tag;
      uVar8 = (uint)plVar5;
    }
    if (0xfffffff4 < uVar8) {
      *(int *)&plVar4->prev = *(int *)&plVar4->prev + 1;
    }
    plVar6[1].next = plVar4;
    plVar6[2].prev = plVar5;
    plVar6[1].prev = (list_head *)&plVar6[1].next;
    pbVar1 = (byte *)((long)&plVar6[-1].next + 5);
    *pbVar1 = *pbVar1 | 1;
    *(undefined1 *)((long)&plVar6[-1].next + 4) = 3;
    plVar4 = plVar7->prev;
    plVar4->next = plVar6;
    plVar6->prev = plVar4;
    plVar6->next = plVar7;
    plVar7->prev = plVar6;
    plVar6 = plVar3;
  }
  return;
}

Assistant:

static void close_var_refs(JSRuntime *rt, JSStackFrame *sf)
{
    struct list_head *el, *el1;
    JSVarRef *var_ref;
    int var_idx;

    list_for_each_safe(el, el1, &sf->var_ref_list) {
        var_ref = list_entry(el, JSVarRef, header.link);
        var_idx = var_ref->var_idx;
        if (var_ref->is_arg)
            var_ref->value = JS_DupValueRT(rt, sf->arg_buf[var_idx]);
        else
            var_ref->value = JS_DupValueRT(rt, sf->var_buf[var_idx]);
        var_ref->pvalue = &var_ref->value;
        /* the reference is no longer to a local variable */
        var_ref->is_detached = TRUE;
        add_gc_object(rt, &var_ref->header, JS_GC_OBJ_TYPE_VAR_REF);
    }
}